

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-properties.c
# Opt level: O3

void gain_specialty(void)

{
  ulong uVar1;
  player_upkeep *ppVar2;
  _Bool _Var3;
  player_ability *ppVar4;
  wchar_t pick;
  char buf [120];
  wchar_t local_9c;
  char local_98 [128];
  
  _Var3 = gain_specialty_menu(&local_9c);
  if (_Var3) {
    ppVar4 = lookup_ability("player",local_9c,L'\0');
    flag_on_dbg(player->specialties,10,local_9c,"player->specialties","pick");
    strnfmt(local_98,0x78,"Gained the %s specialty.",ppVar4->name);
    history_add(player,local_98,L'\n');
    ppVar2 = player->upkeep;
    uVar1._0_4_ = ppVar2->update;
    uVar1._4_4_ = ppVar2->redraw;
    ppVar2->update = (int)(uVar1 | 0x8000000003f);
    ppVar2->redraw = (int)((uVar1 | 0x8000000003f) >> 0x20);
  }
  return;
}

Assistant:

void gain_specialty(void)
{
	int pick;

	/* Make one choice */
	if (gain_specialty_menu(&pick)) {
		char buf[120];
		struct player_ability *ability = lookup_ability("player", pick, 0);

		/* Add it to the specialties */
		pf_on(player->specialties, pick);

		/* Specialty taken */
		strnfmt(buf, sizeof(buf), "Gained the %s specialty.", ability->name);

		/* Write a note */
		history_add(player, buf, HIST_GAIN_SPECIALTY);

		/* Update some stuff */
		player->upkeep->update |= (PU_BONUS | PU_HP | PU_MANA | PU_SPELLS |
								   PU_SPECIALTY | PU_TORCH);

		/* Redraw Study Status */
		player->upkeep->redraw |= (PR_STUDY);
	}
}